

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O2

void __thiscall Semantic::SymbolTable::SymbolTable(SymbolTable *this)

{
  Function *this_00;
  allocator local_9a;
  allocator local_99;
  _Vector_base<Variable_*,_std::allocator<Variable_*>_> local_98;
  _Vector_base<Variable_*,_std::allocator<Variable_*>_> local_78;
  string local_58;
  string local_38;
  
  (this->classes)._M_h._M_buckets = &(this->classes)._M_h._M_single_bucket;
  (this->classes)._M_h._M_bucket_count = 1;
  (this->classes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classes)._M_h._M_element_count = 0;
  (this->classes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->freeFunctions)._M_h._M_buckets = &(this->freeFunctions)._M_h._M_single_bucket;
  (this->freeFunctions)._M_h._M_bucket_count = 1;
  (this->freeFunctions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->freeFunctions)._M_h._M_element_count = 0;
  (this->freeFunctions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->freeFunctions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->freeFunctions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (Function *)operator_new(0xc0);
  std::__cxx11::string::string((string *)&local_38,"main",&local_99);
  std::__cxx11::string::string((string *)&local_58,"void",&local_9a);
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Function::Function(this_00,PUBLIC,&local_38,&local_58,
                     (vector<Variable_*,_std::allocator<Variable_*>_> *)&local_78,
                     (vector<Variable_*,_std::allocator<Variable_*>_> *)&local_98,0);
  std::_Vector_base<Variable_*,_std::allocator<Variable_*>_>::~_Vector_base(&local_98);
  std::_Vector_base<Variable_*,_std::allocator<Variable_*>_>::~_Vector_base(&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  this->main = this_00;
  return;
}

Assistant:

SymbolTable() = default;